

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O2

int __thiscall OIDType::serialise(OIDType *this,uint8_t *buf,size_t max_len)

{
  pointer __src;
  uint uVar1;
  
  uVar1 = BER_CONTAINER::serialise
                    (&this->super_BER_CONTAINER,buf,max_len,
                     (long)(this->data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(this->data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  if (-1 < (int)uVar1) {
    if (this->valid == true) {
      __src = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_start;
      memcpy(buf + uVar1,__src,
             (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)__src);
      uVar1 = ((int)(buf + uVar1) +
              (*(int *)&(this->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
              *(int *)&(this->data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start)) - (int)buf;
    }
    else {
      uVar1 = 0xffffffdb;
    }
  }
  return uVar1;
}

Assistant:

int OIDType::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len, this->data.size());
    CHECK_ENCODE_ERR(i);
    if(!this->valid) return SNMP_BUFFER_ENCODE_ERROR_INVALID_OID;

    uint8_t* ptr = buf + i;
    memcpy(ptr, this->data.data(), this->data.size());

    ptr += this->data.size();
    return ptr - buf;
}